

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<int,QList<int>>::emplace<QList<int>const&>
          (QHash<int,_QList<int>_> *this,int *key,QList<int> *args)

{
  long lVar1;
  bool bVar2;
  int *in_RSI;
  QHash<int,_QList<int>_> *in_RDI;
  long in_FS_OFFSET;
  QHash<int,_QList<int>_> copy;
  QList<int> *in_stack_ffffffffffffff88;
  QList<int> *in_stack_ffffffffffffff90;
  QList<int> *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  piter local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<int,_QList<int>_>::isDetached((QHash<int,_QList<int>_> *)in_stack_ffffffffffffff90);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<int,_QList<int>_>_>::shouldGrow(in_RDI->d);
    if (bVar2) {
      QList<int>::QList(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_38 = (piter)emplace_helper<QList<int>>(in_RDI,in_RSI,in_stack_ffffffffffffff98);
      QList<int>::~QList((QList<int> *)0x9fb29e);
    }
    else {
      local_38 = (piter)emplace_helper<QList<int>const&>
                                  (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<int,_QList<int>_>::QHash
              ((QHash<int,_QList<int>_> *)in_stack_ffffffffffffff90,
               (QHash<int,_QList<int>_> *)in_stack_ffffffffffffff88);
    QHash<int,_QList<int>_>::detach((QHash<int,_QList<int>_> *)in_stack_ffffffffffffff90);
    local_38 = (piter)emplace_helper<QList<int>const&>
                                (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<int,_QList<int>_>::~QHash((QHash<int,_QList<int>_> *)in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_38;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }